

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void h1v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JSAMPARRAY ppJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  ppJVar2 = *output_data_ptr;
  lVar6 = 0;
  lVar7 = 0;
  while ((int)lVar7 < cinfo->max_v_samp_factor) {
    lVar7 = (long)(int)lVar7;
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      pJVar3 = input_data[lVar6];
      pJVar4 = (input_data + lVar6)[(ulong)(iVar8 != 0) * 2 + -1];
      pJVar5 = ppJVar2[lVar7];
      for (lVar9 = 0; (uint)lVar9 < compptr->downsampled_width; lVar9 = lVar9 + 1) {
        bVar1 = pJVar3[lVar9];
        pJVar5[lVar9] =
             (JSAMPLE)((uint)pJVar4[lVar9] + (iVar8 != 0) + 1 + (uint)bVar1 + (uint)bVar1 * 2 >> 2);
      }
      lVar7 = lVar7 + 1;
    }
    lVar6 = lVar6 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h1v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  int thiscolsum, bias;
#else
  JLONG thiscolsum, bias;
#endif
  JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0) {             /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
        bias = 1;
      } else {                  /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
        bias = 2;
      }
      outptr = output_data[outrow++];

      for (colctr = 0; colctr < compptr->downsampled_width; colctr++) {
        thiscolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum + bias) >> 2);
      }
    }
    inrow++;
  }
}